

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkSets.c
# Opt level: O0

uint Lpk_MapSuppRedDecSelect(Lpk_Man_t *p,uint *pTruth,int nVars,int *piVar,int *piVarReused)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  int fVerbose;
  uint Entry;
  int SizeMax;
  int i;
  int nSets;
  uint *pCof1;
  uint *pCof0;
  Vec_Int_t *vSets1;
  Vec_Int_t *vSets0;
  Kit_DsdNtk_t *pTemp;
  Kit_DsdNtk_t *ppNtks [2];
  int *piVarReused_local;
  int *piVar_local;
  int nVars_local;
  uint *pTruth_local;
  Lpk_Man_t *p_local;
  
  vSets1 = p->vSets[0];
  pCof0 = (uint *)p->vSets[1];
  ppNtks[1] = (Kit_DsdNtk_t *)piVarReused;
  pCof1 = (uint *)Vec_PtrEntry(p->vTtNodes,0);
  _i = (uint *)Vec_PtrEntry(p->vTtNodes,1);
  iVar4 = p->pPars->fVeryVerbose;
  if (iVar4 != 0) {
    printf("\nExploring support-reducing bound-sets of function:\n");
    Kit_DsdPrintFromTruth(pTruth,nVars);
  }
  SizeMax = 0;
  for (Entry = 0; (int)Entry < nVars; Entry = Entry + 1) {
    if (iVar4 != 0) {
      printf("Evaluating variable %c:\n",(ulong)(Entry + 0x61));
    }
    Kit_TruthCofactor0New(pCof1,pTruth,nVars,Entry);
    Kit_TruthCofactor1New(_i,pTruth,nVars,Entry);
    pTemp = Kit_DsdDecompose(pCof1,nVars);
    ppNtks[0] = Kit_DsdDecompose(_i,nVars);
    vSets0 = (Vec_Int_t *)pTemp;
    pTemp = Kit_DsdExpand(pTemp);
    Kit_DsdNtkFree((Kit_DsdNtk_t *)vSets0);
    vSets0 = (Vec_Int_t *)ppNtks[0];
    ppNtks[0] = Kit_DsdExpand(ppNtks[0]);
    Kit_DsdNtkFree((Kit_DsdNtk_t *)vSets0);
    if (iVar4 != 0) {
      Kit_DsdPrint(_stdout,pTemp);
      Kit_DsdPrint(_stdout,ppNtks[0]);
    }
    Lpk_ComputeSets(pTemp,vSets1);
    Lpk_ComputeSets(ppNtks[0],(Vec_Int_t *)pCof0);
    if (iVar4 != 0) {
      Lpk_PrintSets(vSets1);
      Lpk_PrintSets((Vec_Int_t *)pCof0);
    }
    Kit_DsdNtkFree(pTemp);
    Kit_DsdNtkFree(ppNtks[0]);
    Lpk_ComposeSets(vSets1,(Vec_Int_t *)pCof0,nVars,Entry,Lpk_MapSuppRedDecSelect::pStore,&SizeMax,
                    Lpk_MapSuppRedDecSelect::nStoreSize);
  }
  if (iVar4 != 0) {
    printf("\n");
    for (Entry = 0; (int)Entry < SizeMax; Entry = Entry + 1) {
      Lpk_MapSuppPrintSet(Lpk_MapSuppRedDecSelect::pStore + (int)Entry,Entry);
    }
  }
  fVerbose = 0;
  Lpk_MapSuppRedDecSelect::pSetBest = (Lpk_Set_t *)0x0;
  for (Entry = 0; (int)Entry < SizeMax; Entry = Entry + 1) {
    lVar5 = (long)(int)Entry;
    Lpk_MapSuppRedDecSelect::pSet = Lpk_MapSuppRedDecSelect::pStore + lVar5;
    if (((int)Lpk_MapSuppRedDecSelect::pStore[lVar5].Size <= p->pPars->nLutSize + -1) &&
       (fVerbose < Lpk_MapSuppRedDecSelect::pStore[lVar5].Size)) {
      fVerbose = (int)Lpk_MapSuppRedDecSelect::pStore[lVar5].Size;
      Lpk_MapSuppRedDecSelect::pSetBest = Lpk_MapSuppRedDecSelect::pSet;
    }
  }
  if (Lpk_MapSuppRedDecSelect::pSetBest == (Lpk_Set_t *)0x0) {
    if (iVar4 != 0) {
      printf("Could not select a subset.\n");
    }
    p_local._4_4_ = 0;
  }
  else {
    if (iVar4 != 0) {
      printf("Selected the following subset:\n");
      Lpk_MapSuppPrintSet(Lpk_MapSuppRedDecSelect::pSetBest,
                          (int)((long)&Lpk_MapSuppRedDecSelect::pSetBest[-0x17c32f].uSubset0 / 0xc))
      ;
    }
    uVar3 = Lpk_MapSuppRedDecSelect::pSetBest->uSubset0;
    uVar1 = Lpk_MapSuppRedDecSelect::pSetBest->uSubset1;
    uVar2 = Kit_BitMask(nVars);
    uVar3 = uVar2 & (1 << (Lpk_MapSuppRedDecSelect::pSetBest->iVar & 0x1fU) ^ 0xffffffffU) &
            ((uVar3 | uVar1) >> 0x10 ^ 0xffffffff);
    if (uVar3 == 0) {
      __assert_fail("Entry",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkSets.c"
                    ,0x1b0,
                    "unsigned int Lpk_MapSuppRedDecSelect(Lpk_Man_t *, unsigned int *, int, int *, int *)"
                   );
    }
    iVar4 = Kit_WordFindFirstBit(uVar3);
    ppNtks[1]->nVars = (short)iVar4;
    ppNtks[1]->nNodesAlloc = (short)((uint)iVar4 >> 0x10);
    *piVar = (int)Lpk_MapSuppRedDecSelect::pSetBest->iVar;
    p_local._4_4_ =
         Lpk_MapSuppRedDecSelect::pSetBest->uSubset1 << 0x10 |
         Lpk_MapSuppRedDecSelect::pSetBest->uSubset0 & 0xffff;
  }
  return p_local._4_4_;
}

Assistant:

unsigned Lpk_MapSuppRedDecSelect( Lpk_Man_t * p, unsigned * pTruth, int nVars, int * piVar, int * piVarReused )
{
    static int nStoreSize = 256;
    static Lpk_Set_t pStore[256], * pSet, * pSetBest;
    Kit_DsdNtk_t * ppNtks[2], * pTemp;
    Vec_Int_t * vSets0 = p->vSets[0];
    Vec_Int_t * vSets1 = p->vSets[1];
    unsigned * pCof0 = (unsigned *)Vec_PtrEntry( p->vTtNodes, 0 );
    unsigned * pCof1 = (unsigned *)Vec_PtrEntry( p->vTtNodes, 1 );
    int nSets, i, SizeMax;//, SRedMax;
    unsigned Entry;
    int fVerbose = p->pPars->fVeryVerbose;
//    int fVerbose = 0;

    // collect decomposable subsets for each pair of cofactors
    if ( fVerbose )
    {
        printf( "\nExploring support-reducing bound-sets of function:\n" );
        Kit_DsdPrintFromTruth( pTruth, nVars );
    }
    nSets = 0;
    for ( i = 0; i < nVars; i++ )
    {
        if ( fVerbose )
        printf( "Evaluating variable %c:\n", 'a'+i );
        // evaluate the cofactor pair
        Kit_TruthCofactor0New( pCof0, pTruth, nVars, i );
        Kit_TruthCofactor1New( pCof1, pTruth, nVars, i );
        // decompose and expand
        ppNtks[0] = Kit_DsdDecompose( pCof0, nVars );
        ppNtks[1] = Kit_DsdDecompose( pCof1, nVars );
        ppNtks[0] = Kit_DsdExpand( pTemp = ppNtks[0] );      Kit_DsdNtkFree( pTemp );
        ppNtks[1] = Kit_DsdExpand( pTemp = ppNtks[1] );      Kit_DsdNtkFree( pTemp );
        if ( fVerbose )
        Kit_DsdPrint( stdout, ppNtks[0] );
        if ( fVerbose )
        Kit_DsdPrint( stdout, ppNtks[1] );
        // compute subsets
        Lpk_ComputeSets( ppNtks[0], vSets0 );
        Lpk_ComputeSets( ppNtks[1], vSets1 );
        // print subsets
        if ( fVerbose )
        Lpk_PrintSets( vSets0 );
        if ( fVerbose )
        Lpk_PrintSets( vSets1 );
        // free the networks
        Kit_DsdNtkFree( ppNtks[0] );
        Kit_DsdNtkFree( ppNtks[1] );
        // evaluate the pair
        Lpk_ComposeSets( vSets0, vSets1, nVars, i, pStore, &nSets, nStoreSize );
    }

    // print the results
    if ( fVerbose )
    printf( "\n" );
    if ( fVerbose )
    for ( i = 0; i < nSets; i++ )
        Lpk_MapSuppPrintSet( pStore + i, i );

    // choose the best subset
    SizeMax = 0;
    pSetBest = NULL;
    for ( i = 0; i < nSets; i++ )
    {
        pSet = pStore + i;
        if ( pSet->Size > p->pPars->nLutSize - 1 )
            continue;
        if ( SizeMax < pSet->Size )
        {
            pSetBest = pSet;
            SizeMax = pSet->Size;
        }
    }
/*
    // if the best is not choosen, select the one with largest reduction
    SRedMax = 0;
    if ( pSetBest == NULL )
    {
        for ( i = 0; i < nSets; i++ )
        {
            pSet = pStore + i;
            if ( SRedMax < pSet->SRed )
            {
                pSetBest = pSet;
                SRedMax = pSet->SRed;
            }
        }
    }
*/
    if ( pSetBest == NULL )
    {
        if ( fVerbose )
        printf( "Could not select a subset.\n" );
        return 0;
    }
    else
    {
        if ( fVerbose )
        printf( "Selected the following subset:\n" );
        if ( fVerbose )
        Lpk_MapSuppPrintSet( pSetBest, pSetBest - pStore );
    }

    // prepare the return result
    // get the remaining variables
    Entry = ((pSetBest->uSubset0 >> 16) | (pSetBest->uSubset1 >> 16));
    // get the variables to be removed
    Entry = Kit_BitMask(nVars) & ~(1<<pSetBest->iVar) & ~Entry;
    // make sure there are some - otherwise it is not supp-red
    assert( Entry );
    // remember the first such variable
    *piVarReused = Kit_WordFindFirstBit( Entry );
    *piVar = pSetBest->iVar;
    return (pSetBest->uSubset1 << 16) | (pSetBest->uSubset0 & 0xFFFF);
}